

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall
ICM::Function::Signature::checkType
          (Signature *this,vector<ICM::TypeObject,_std::allocator<ICM::TypeObject>_> *argT)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  bVar4 = this->last_is_args;
  uVar5 = (*(long *)(argT + 8) - *(long *)argT >> 3) * -0x5555555555555555;
  uVar1 = (this->InType)._capacity;
  if (bVar4 == true) {
    if (uVar1 <= uVar5) {
LAB_00139535:
      sVar2 = (this->InType)._capacity;
      lVar6 = sVar2 - bVar4;
      if (lVar6 != 0) {
        lVar7 = 0;
        lVar8 = lVar6;
        do {
          bVar3 = TypeObject::checkType
                            ((TypeObject *)
                             ((long)&((this->InType)._data.
                                      super___shared_ptr<ICM::TypeObject,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->type + lVar7),(TypeObject *)(*(long *)argT + lVar7));
          if (!bVar3) {
            return false;
          }
          lVar7 = lVar7 + 0x18;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      if (this->last_is_args == true) {
        lVar8 = *(long *)(argT + 8) - *(long *)argT >> 3;
        if (lVar6 == lVar8 * -0x5555555555555555) {
          return true;
        }
        lVar8 = (sVar2 - bVar4) + lVar8 * 0x5555555555555555;
        lVar6 = lVar6 * 0x18;
        do {
          lVar8 = lVar8 + 1;
          bVar4 = TypeObject::checkType
                            ((this->InType)._data.
                             super___shared_ptr<ICM::TypeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             + ((this->InType)._capacity - 1),(TypeObject *)(*(long *)argT + lVar6))
          ;
          if (lVar8 == 0) {
            return bVar4;
          }
          lVar6 = lVar6 + 0x18;
        } while (bVar4);
        return bVar4;
      }
      return true;
    }
  }
  else if (uVar5 - uVar1 == 0) goto LAB_00139535;
  return false;
}

Assistant:

bool Signature::checkType(const vector<TypeObject> &argT) const {
			// Check Size
			if (last_is_args) {
				if (argT.size() < InType.size())
					return false;
			}
			else if (argT.size() != InType.size()) {
				return false;
			}
			// Check Type
			size_t size = last_is_args ? InType.size() - 1 : InType.size();
			for (auto i : Range<size_t>(0, size))
				if (!InType[i].checkType(argT[i]))
					return false;
			if (last_is_args) {
				for (auto i : Range<size_t>(size, argT.size()))
					if (!InType.back().checkType(argT[i]))
						return false;
			}
			return true;
		}